

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClusterList.h
# Opt level: O0

uint __thiscall
SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u>::Lookup<false,false>
          (SegmentClusterList<unsigned_int,Memory::JitArenaAllocator,16u> *this,uint index)

{
  uint index_00;
  uint trueRoot;
  uint currentValue;
  uint index_local;
  SegmentClusterList<unsigned_int,_Memory::JitArenaAllocator,_16U> *this_local;
  
  this_local._4_4_ = index;
  if (((index < *(uint *)this) && (*(long *)(*(long *)(this + 8) + (ulong)(index >> 4) * 8) != 0))
     && (index_00 = *(uint *)(*(long *)(*(long *)(this + 8) + (ulong)(index >> 4) * 8) +
                             (ulong)(index & 0xf) * 4), index_00 != index)) {
    this_local._4_4_ = Lookup<false,false>(this,index_00);
    *(uint *)(*(long *)(*(long *)(this + 8) + (ulong)(index >> 4) * 8) + (ulong)(index & 0xf) * 4) =
         this_local._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

inline indexType Lookup(indexType index)
    {
        if (index >= maxIndex || backingStore[index / numPerSegment] == nullptr)
        {
            // Not being there simply means that it's still an identity mapping
            if(createBacking)
            {
                CreateBacking(index);
            }
            return index;
        }
        if (assumeConsolidated)
        {
            // If the list is consolidated, then we can return whatever's there
            return backingStore[index / numPerSegment][index % numPerSegment];
        }
        else
        {
            // If it's not consolidated, we need to follow the chain down, and update each entry to the root
            indexType currentValue = backingStore[index / numPerSegment][index % numPerSegment];
            if (currentValue == index)
            {
                return index;
            }
            indexType trueRoot = Lookup<false, assumeConsolidated>(currentValue);
            backingStore[index / numPerSegment][index % numPerSegment] = trueRoot;
            return trueRoot;
        }
    }